

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

int __thiscall PInt::GetStoreOp(PInt *this)

{
  PInt *this_local;
  
  if (*(int *)&this->field_0x24 == 4) {
    this_local._4_4_ = 0x22;
  }
  else if (*(int *)&this->field_0x24 == 1) {
    this_local._4_4_ = 0x1e;
  }
  else {
    if (*(int *)&this->field_0x24 != 2) {
      __assert_fail("0 && \"Unhandled integer size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0x430,"virtual int PInt::GetStoreOp() const");
    }
    this_local._4_4_ = 0x20;
  }
  return this_local._4_4_;
}

Assistant:

int PInt::GetStoreOp() const
{
	if (Size == 4)
	{
		return OP_SW;
	}
	else if (Size == 1)
	{
		return OP_SB;
	}
	else if (Size == 2)
	{
		return OP_SH;
	}
	else
	{
		assert(0 && "Unhandled integer size");
		return OP_NOP;
	}
}